

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

shared_ptr<const_void> __thiscall
pstore::database::get_spanning
          (database *this,address addr,size_t size,bool initialized,bool writable)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _func_int **__dest;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> this_00;
  undefined7 in_register_00000009;
  int line;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _func_int **__n;
  ulong uVar7;
  void *pvVar8;
  undefined1 in_R9B;
  char *str;
  _func_int **pp_Var9;
  uint uVar10;
  ulong uVar11;
  shared_ptr<const_void> sVar12;
  
  pp_Var9 = (_func_int **)CONCAT71(in_register_00000009,initialized);
  __dest = (_func_int **)operator_new__((ulong)pp_Var9);
  this_00._M_head_impl = (array<pstore::sat_entry,_65536UL> *)operator_new(0x38);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)(this_00._M_head_impl)->_M_elems + 0x10))
  ->_vptr__Sp_counted_base = (_func_int **)addr.a_;
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(this_00._M_head_impl)->_M_elems + 0x10);
  p_Var6->_M_use_count = (int)size;
  p_Var6->_M_weak_count = (int)(size >> 0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)(this_00._M_head_impl)->_M_elems + 0x20))
  ->_vptr__Sp_counted_base = pp_Var9;
  *(undefined1 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)(this_00._M_head_impl)->_M_elems + 0x20)
    )->_M_use_count = in_R9B;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)(this_00._M_head_impl)->_M_elems + 8))->
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  *(undefined ***)(this_00._M_head_impl)->_M_elems = &PTR___Sp_counted_base_0015e190;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)(this_00._M_head_impl)->_M_elems + 0x30))
  ->_vptr__Sp_counted_base = __dest;
  if (!writable) {
LAB_0012c629:
    this->_vptr_database = __dest;
    (this->storage_).sat_._M_t.
    super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
    .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
         this_00._M_head_impl;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)(this_00._M_head_impl)->_M_elems + 8);
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)(this_00._M_head_impl)->_M_elems + 8);
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_head_impl);
    sVar12.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar12.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<const_void>)sVar12.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  uVar11 = size >> 0x16;
  lVar3 = *(long *)(addr.a_ + 8);
  uVar7 = (ulong)(((uint)uVar11 & 0xffff) << 5);
  pvVar8 = *(void **)(lVar3 + uVar7);
  line = 0x140;
  str = 
  "segment_pointer.value != nullptr && segment_pointer.region != nullptr && segment_pointer.is_valid ()"
  ;
  if (((pvVar8 != (void *)0x0) && (lVar4 = *(long *)(uVar7 + lVar3 + 0x10), lVar4 != 0)) &&
     (pvVar5 = *(void **)(lVar4 + 8), pvVar5 <= pvVar8)) {
    pvVar2 = (void *)(*(long *)(lVar4 + 0x28) + (long)pvVar5);
    if ((void *)((long)pvVar8 + 0x400000U) <= pvVar2) {
      pvVar8 = (void *)((long)pvVar8 + (ulong)((uint)size & 0x3fffff));
      line = 0x148;
      str = 
      "in_store_ptr >= region_base && in_store_ptr <= region_base + segment_pointer.region->size ()"
      ;
      if ((pvVar5 <= pvVar8) && (pvVar8 <= pvVar2)) {
        __n = (_func_int **)((long)pvVar5 + (*(long *)(lVar4 + 0x28) - (long)pvVar8));
        if (pp_Var9 <= __n) {
          __n = pp_Var9;
        }
        memcpy(__dest,pvVar8,(size_t)__n);
        pp_Var9 = (_func_int **)((long)pp_Var9 - (long)__n);
        if (pp_Var9 != (_func_int **)0x0) {
          pvVar8 = (void *)((long)__dest + (long)__n);
          do {
            uVar7 = (long)__n + 0x3fffffU >> 0x16;
            if (0xfffe < uVar7) {
              line = 0x15c;
              str = "inc < std::numeric_limits<address::segment_type>::max ()";
              goto LAB_0012c68e;
            }
            if (0xffff < (uVar11 & 0xffff) + uVar7) {
              line = 0x15d;
              str = "segment + inc < sat_elements";
              goto LAB_0012c68e;
            }
            uVar10 = (int)uVar11 + (int)uVar7;
            uVar11 = (ulong)uVar10;
            lVar4 = *(long *)(lVar3 + 0x10 + (ulong)((uVar10 & 0xffff) << 5));
            if (lVar4 == 0) {
              line = 0x161;
              str = "region != nullptr";
              goto LAB_0012c68e;
            }
            __n = *(_func_int ***)(lVar4 + 0x28);
            if (pp_Var9 <= *(_func_int ***)(lVar4 + 0x28)) {
              __n = pp_Var9;
            }
            memcpy(pvVar8,*(void **)(lVar4 + 8),(size_t)__n);
            pvVar8 = (void *)((long)pvVar8 + (long)__n);
            pp_Var9 = (_func_int **)((long)pp_Var9 - (long)__n);
          } while (pp_Var9 != (_func_int **)0x0);
        }
        goto LAB_0012c629;
      }
    }
  }
LAB_0012c68e:
  assert_failed(str,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                ,line);
}

Assistant:

auto database::get_spanning (address const addr, std::size_t const size, bool const initialized,
                                 bool const writable) const -> std::shared_ptr<void const> {
        // The deleter is called when the shared pointer that we're about to return is
        // released.
        auto deleter = [this, addr, size, writable] (std::uint8_t * const p) {
            if (writable) {
                // Check that this code is not trying to write back to read-only storage. This error
                // can occur if a non-const pointer is being destroyed after the containing
                // transaction has been committed.
                PSTORE_ASSERT (addr >= this->first_writable_address ());

                // If we're returning a writable pointer then we must copy the (potentially
                // modified) contents back to the data store.
                storage_.copy<storage::copy_to_store_traits> (
                    addr, size, p,
                    [] (std::uint8_t * const dest, std::uint8_t const * const src,
                        std::size_t const n) { std::memcpy (dest, src, n); });
            }
            delete[] p;
        };

        // Create the memory block that we'll be returning, attaching a suitable deleter
        // which will be responsible for copying the data back to the store (if we're providing
        // a writable pointer).
        std::shared_ptr<std::uint8_t> const result{new std::uint8_t[size], deleter};

        if (initialized) {
            // Copy from the data store's regions to the newly allocated memory block.
            storage_.copy<storage::copy_from_store_traits> (
                addr, size, result.get (),
                [] (std::uint8_t const * const src, std::uint8_t * const dest,
                    std::size_t const n) { std::memcpy (dest, src, n); });
        }
        return std::static_pointer_cast<void const> (result);
    }